

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O3

void pltcalc::outputrows<pltcalc::outrec_const&>(outrec *o,int type,FILE *outFile)

{
  int strLen;
  char buffer [4096];
  char local_1018 [4104];
  
  strLen = sprintf(local_1018,"%d,%d,%d,%d,%0.2f,%0.2f,%0.2f,%d\n",(double)o->mean,
                   (double)o->standard_deviation,(double)o->exp_value,type,
                   (ulong)(uint)o->summary_id,(ulong)(uint)o->period_no,(ulong)(uint)o->event_id,
                   o->occ_date_id);
  writeoutput(local_1018,strLen,outFile);
  return;
}

Assistant:

void outputrows(const T& o, const int type, FILE * outFile)
	{
		char buffer[4096];
		int strLen;
		strLen = sprintf(buffer, "%d,%d,%d,%d,%0.2f,%0.2f,%0.2f,%d\n",
				 type, o.summary_id, o.period_no, o.event_id,
				 o.mean, o.standard_deviation, o.exp_value,
				 o.occ_date_id);
		writeoutput(buffer, strLen, outFile);
	}